

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseFile(X3DImporter *this,string *pFile,IOSystem *pIOHandler)

{
  bool bVar1;
  IOStream *__p;
  pointer pIVar2;
  DeadlyImportError *pDVar3;
  pointer pFVar4;
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  undefined1 local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_> local_b8;
  undefined1 local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_> OldReader;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  X3DImporter *this_local;
  
  std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::unique_ptr
            ((unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_> *)&file,
             &this->mReader);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar2 == (pointer)0x0) {
    local_a9 = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open X3D file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar3,&local_88);
    local_a9 = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  FIReader::create((FIReader *)&local_b8,pIVar2);
  std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator=
            (&this->mReader,&local_b8);
  std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::~unique_ptr(&local_b8);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->mReader);
  if (!bVar1) {
    local_f9 = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_f8,"Failed to create XML reader for file",pFile);
    std::operator+(&local_d8,&local_f8,".");
    DeadlyImportError::DeadlyImportError(pDVar3,&local_d8);
    local_f9 = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"urn:web3d:x3d:fi-vocabulary-3.2",&local_121);
  (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x15])
            (pFVar4,local_120,X3D_vocabulary_3_2);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"urn:web3d:x3d:fi-vocabulary-3.3",&local_149);
  (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x15])
            (pFVar4,local_148,X3D_vocabulary_3_3);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  ParseNode_Root(this);
  std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator=
            (&this->mReader,
             (unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_> *)&file);
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_30);
  std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::~unique_ptr
            ((unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_> *)&file);
  return;
}

Assistant:

void X3DImporter::ParseFile(const std::string& pFile, IOSystem* pIOHandler)
{
    std::unique_ptr<FIReader> OldReader = std::move(mReader);// store current XMLreader.
    std::unique_ptr<IOStream> file(pIOHandler->Open(pFile, "rb"));

	// Check whether we can read from the file
    if ( file.get() == nullptr )
    {
        throw DeadlyImportError( "Failed to open X3D file " + pFile + "." );
    }
	mReader = FIReader::create(file.get());
    if ( !mReader )
    {
        throw DeadlyImportError( "Failed to create XML reader for file" + pFile + "." );
    }
    mReader->registerVocabulary("urn:web3d:x3d:fi-vocabulary-3.2", &X3D_vocabulary_3_2);
    mReader->registerVocabulary("urn:web3d:x3d:fi-vocabulary-3.3", &X3D_vocabulary_3_3);
	// start reading
	ParseNode_Root();

	// restore old XMLreader
	mReader = std::move(OldReader);
}